

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

uint __thiscall Engine::getLocalFunctionNameByString(Engine *this,string *name)

{
  __type _Var1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if (this->localFunctionsCount <= uVar3) {
      return 0xffffffff;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(this->localFunctionNames->_M_dataplus)._M_p + lVar2),name);
    if (_Var1) break;
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x20;
  }
  return (uint)uVar3;
}

Assistant:

unsigned int Engine::getLocalFunctionNameByString(std::string name) {
	unsigned int i;
	for (i = 0; i < this->localFunctionsCount; i++) {
		if (this->localFunctionNames[i] == name) {
			return i;
		}
	}
	return CANT_FIND;
}